

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

bool __thiscall google::protobuf::FieldDescriptor::is_repeated(FieldDescriptor *this)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  
  bVar1 = this->field_0x1;
  if (0xbf < bVar1 == ((bVar1 >> 5 & 1) != 0)) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       ((bool)(bVar1 >> 5 & 1),0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return (bool)((this->field_0x1 & 0x20) >> 5);
  }
  is_repeated();
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  ABSL_DCHECK_EQ(is_repeated_, static_cast<Label>(label_) == LABEL_REPEATED);
  return is_repeated_;
}